

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amqpvalue_to_string.c
# Opt level: O0

int string_concat(char **string,char *to_concat)

{
  size_t sVar1;
  char *pcVar2;
  LOGGER_LOG p_Var3;
  size_t local_50;
  LOGGER_LOG l;
  size_t realloc_size;
  size_t src_length;
  size_t length;
  char *new_string;
  int result;
  char *to_concat_local;
  char **string_local;
  
  sVar1 = strlen(to_concat);
  sVar1 = sVar1 + 1;
  if (*string == (char *)0x0) {
    realloc_size = 0;
  }
  else {
    realloc_size = strlen(*string);
  }
  if (realloc_size < -sVar1 - 1) {
    local_50 = realloc_size + sVar1;
  }
  else {
    local_50 = 0xffffffffffffffff;
  }
  if ((local_50 != 0xffffffffffffffff) &&
     (pcVar2 = (char *)realloc(*string,local_50), pcVar2 != (char *)0x0)) {
    *string = pcVar2;
    memcpy(*string + realloc_size,to_concat,sVar1);
    return 0;
  }
  p_Var3 = xlogging_get_log_function();
  if (p_Var3 != (LOGGER_LOG)0x0) {
    (*p_Var3)(AZ_LOG_ERROR,
              "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/src/amqpvalue_to_string.c"
              ,"string_concat",0x2b,1,"Cannot allocate memory for the new string, size:%zu",local_50
             );
  }
  return 0x2c;
}

Assistant:

static int string_concat(char** string, const char* to_concat)
{
    int result;
    char* new_string;
    size_t length = strlen(to_concat) + 1;
    size_t src_length;

    if (*string != NULL)
    {
        src_length = strlen(*string);
    }
    else
    {
        src_length = 0;
    }

    size_t realloc_size = safe_add_size_t(src_length, length);
    if (realloc_size == SIZE_MAX ||
        (new_string = (char*)realloc(*string, realloc_size)) == NULL)
    {
        LogError("Cannot allocate memory for the new string, size:%zu", realloc_size);
        result = MU_FAILURE;
    }
    else
    {
        *string = new_string;
        (void)memcpy(*string + src_length, to_concat, length);
        result = 0;
    }

    return result;
}